

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.cpp
# Opt level: O2

int parseChunkLine(CircularBuffer *buf,int *len)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  char length_str [40];
  
  iVar1 = JetHead::CircularBuffer::getLength(buf);
  if (iVar1 == 0) {
    return -1;
  }
  uVar4 = 0;
  while( true ) {
    iVar1 = JetHead::CircularBuffer::byteAt(buf,(int)uVar4);
    if (iVar1 < 0) {
      return iVar1;
    }
    if ((iVar1 == 0xd) || (iVar1 == 0x3b)) break;
    length_str[uVar4] = (char)iVar1;
    uVar4 = uVar4 + 1;
  }
  length_str[uVar4 & 0xffffffff] = '\0';
  iVar3 = (int)uVar4 + 2;
  do {
    if (iVar1 == 0xd) {
      iVar1 = JetHead::CircularBuffer::byteAt(buf,iVar3 + -1);
      if (iVar1 != 10) {
        return -1;
      }
      lVar2 = strtol(length_str,(char **)0x0,0x10);
      *len = (int)lVar2;
      return iVar3;
    }
    iVar1 = JetHead::CircularBuffer::byteAt(buf,iVar3 + -1);
    iVar3 = iVar3 + 1;
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

int parseChunkLine( const CircularBuffer &buf, int &len )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	char length_str[ 40 ];
	int i = 0;
	int j = 0;
	int c;

	if (!buf.getLength())
		return -1;
				
	while ( 1 )
	{
		c = buf.byteAt( i++ );	

		if ( c < 0 )
			return c;

		if ( c == ';' || c == '\r')
			break;
		length_str[ j++ ] = c;
	}

	length_str[ j ] = 0;

	while ( c != '\r' )
	{
		c = buf.byteAt( i++ );	

		if ( c < 0 )
			return c;
	}
	
	// if CRLF move past LF
	c = buf.byteAt(i);
	if ( c == '\n' )
		i++;
	else
		return -1;
		
	len = strtol( length_str, NULL, 16 );

	LOG( "string %s", length_str );
	return i;
}